

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O0

result<toml::detail::region,_toml::detail::none_t> * __thiscall
toml::detail::
sequence<toml::detail::repeat<toml::detail::either<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)10,(char)31>,toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)127>>>,toml::detail::sequence<toml::detail::character<(char)92>,toml::detail::either<toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)98>,toml::detail::character<(char)102>,toml::detail::character<(char)110>,toml::detail::character<(char)114>,toml::detail::character<(char)116>,toml::detail::sequence<toml::detail::character<(char)117>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<4ul>>>,toml::detail::sequence<toml::detail::character<(char)85>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<8ul>>>>>>,toml::detail::unlimited>,toml::detail::character<(char)34>>
::invoke<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
          (result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,
          sequence<toml::detail::repeat<toml::detail::either<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)10,(char)31>,toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)127>>>,toml::detail::sequence<toml::detail::character<(char)92>,toml::detail::either<toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)98>,toml::detail::character<(char)102>,toml::detail::character<(char)110>,toml::detail::character<(char)114>,toml::detail::character<(char)116>,toml::detail::sequence<toml::detail::character<(char)117>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<4ul>>>,toml::detail::sequence<toml::detail::character<(char)85>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<8ul>>>>>>,toml::detail::unlimited>,toml::detail::character<(char)34>>
          *this,location *loc,region *reg,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first)

{
  bool bVar1;
  value_type *other;
  location local_e0;
  undefined4 local_98;
  failure_type local_81;
  region *local_80;
  undefined1 local_78 [8];
  result<toml::detail::region,_toml::detail::none_t> rslt;
  region *reg_local;
  location *loc_local;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first_local;
  
  rslt.field_1.succ.value.last_._M_current = (const_iterator)loc;
  repeat<toml::detail::either<toml::detail::exclude<toml::detail::either<toml::detail::in_range<'\x00',_'\b'>,_toml::detail::in_range<'\n',_'\x1f'>,_toml::detail::character<'"'>,_toml::detail::character<'\\'>,_toml::detail::character<'\x7f'>_>_>,_toml::detail::sequence<toml::detail::character<'\\'>,_toml::detail::either<toml::detail::character<'"'>,_toml::detail::character<'\\'>,_toml::detail::character<'b'>,_toml::detail::character<'f'>,_toml::detail::character<'n'>,_toml::detail::character<'r'>,_toml::detail::character<'t'>,_toml::detail::sequence<toml::detail::character<'u'>,_toml::detail::repeat<toml::detail::either<toml::detail::in_range<'0',_'9'>,_toml::detail::in_range<'A',_'F'>,_toml::detail::in_range<'a',_'f'>_>,_toml::detail::exactly<4UL>_>_>,_toml::detail::sequence<toml::detail::character<'U'>,_toml::detail::repeat<toml::detail::either<toml::detail::in_range<'0',_'9'>,_toml::detail::in_range<'A',_'F'>,_toml::detail::in_range<'a',_'f'>_>,_toml::detail::exactly<8UL>_>_>_>_>_>,_toml::detail::unlimited>
  ::invoke((result<toml::detail::region,_toml::detail::none_t> *)local_78,(location *)this);
  bVar1 = result<toml::detail::region,_toml::detail::none_t>::is_err
                    ((result<toml::detail::region,_toml::detail::none_t> *)local_78);
  if (bVar1) {
    local_80 = reg;
    location::reset((location *)this,(const_iterator)reg);
    none();
    result<toml::detail::region,_toml::detail::none_t>::result(__return_storage_ptr__,&local_81);
  }
  else {
    other = result<toml::detail::region,_toml::detail::none_t>::unwrap
                      ((result<toml::detail::region,_toml::detail::none_t> *)local_78);
    region::operator+=((region *)loc,other);
    region::region((region *)&local_e0,(region *)loc);
    sequence<toml::detail::character<(char)34>>::
    invoke<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              (__return_storage_ptr__,(sequence<toml::detail::character<(char)34>> *)this,&local_e0,
               reg,first);
    region::~region((region *)&local_e0);
  }
  local_98 = 1;
  result<toml::detail::region,_toml::detail::none_t>::~result
            ((result<toml::detail::region,_toml::detail::none_t> *)local_78);
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc, region reg, Iterator first)
    {
        const auto rslt = Head::invoke(loc);
        if(rslt.is_err())
        {
            loc.reset(first);
            return none();
        }
        reg += rslt.unwrap(); // concat regions
        return sequence<Tail...>::invoke(loc, std::move(reg), first);
    }